

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::PortConcatenationSyntax::getChild(PortConcatenationSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  long in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff98;
  Info *in_stack_ffffffffffffffa0;
  nullptr_t in_stack_ffffffffffffffa8;
  
  if (in_RDX == 0) {
    token.info = in_stack_ffffffffffffffa0;
    token._0_8_ = in_stack_ffffffffffffff98;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x6f7f5b,token);
  }
  else if (in_RDX == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x28),in_stack_ffffffffffffff98);
  }
  else if (in_RDX == 2) {
    token_00.info = in_stack_ffffffffffffffa0;
    token_00._0_8_ = in_stack_ffffffffffffff98;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x6f7fc2,token_00);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax PortConcatenationSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return openBrace;
        case 1: return &references;
        case 2: return closeBrace;
        default: return nullptr;
    }
}